

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::MustBeInDebugMode(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  void *pvVar4;
  
  bVar2 = Utf8SourceInfo::IsInDebugMode
                    ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x13f4,"(GetUtf8SourceInfo()->IsInDebugMode())",
                                "GetUtf8SourceInfo()->IsInDebugMode()");
    if (!bVar2) goto LAB_006d105e;
    *puVar3 = 0;
  }
  if ((this->m_sourceInfo).pSpanSequence != (Type)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x13f5,"(m_sourceInfo.pSpanSequence == nullptr)",
                                "m_sourceInfo.pSpanSequence == nullptr");
    if (!bVar2) goto LAB_006d105e;
    *puVar3 = 0;
  }
  pvVar4 = FunctionProxy::GetAuxPtrWithLock<(Js::FunctionProxy::AuxPointerType)4,void*>
                     ((FunctionProxy *)this);
  if (pvVar4 == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x13f6,"(this->GetStatementMaps() != nullptr)",
                                "this->GetStatementMaps() != nullptr");
    if (!bVar2) {
LAB_006d105e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

void FunctionBody::MustBeInDebugMode()
    {
        Assert(GetUtf8SourceInfo()->IsInDebugMode());
        Assert(m_sourceInfo.pSpanSequence == nullptr);
        Assert(this->GetStatementMaps() != nullptr);
    }